

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O2

llama_token __thiscall mtmd_context::lookup_token(mtmd_context *this,string *token_text)

{
  __type _Var1;
  int iVar2;
  llama_vocab *vocab;
  int token;
  string local_50;
  
  vocab = (llama_vocab *)llama_model_get_vocab(this->text_model);
  iVar2 = llama_vocab_n_tokens(vocab);
  token = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  while( true ) {
    if (iVar2 == token) {
      return -1;
    }
    token_to_piece_abi_cxx11_(&local_50,this,vocab,token,true);
    _Var1 = std::operator==(&local_50,token_text);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) break;
    token = token + 1;
  }
  return token;
}

Assistant:

llama_token lookup_token(const std::string & token_text) {
        const llama_vocab * vocab = llama_model_get_vocab(text_model);
        const int n_vocab = llama_vocab_n_tokens(vocab);
        for (int i = 0; i < n_vocab; i++) {
            if (token_to_piece(vocab, i, true) == token_text) {
                return i;
            }
        }
        return LLAMA_TOKEN_NULL;
    }